

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

TValue * index2addr(lua_State *L,int idx)

{
  CallInfo *pCVar1;
  lua_CFunction p_Var2;
  lua_State *local_40;
  CClosure *func;
  TValue *o;
  CallInfo *ci;
  int idx_local;
  lua_State *L_local;
  
  pCVar1 = L->ci;
  if (idx < 1) {
    if (idx < -0xf4627) {
      if (idx == -0xf4628) {
        L_local = (lua_State *)&L->l_G->l_registry;
      }
      else if (pCVar1->func->tt_ == 0x16) {
        L_local = (lua_State *)&luaO_nilobject_;
      }
      else {
        p_Var2 = (pCVar1->func->value_).f;
        if ((int)(uint)(byte)p_Var2[10] < -idx + -0xf4628) {
          local_40 = (lua_State *)&luaO_nilobject_;
        }
        else {
          local_40 = (lua_State *)(p_Var2 + (long)(-idx + -0xf4629) * 0x10 + 0x20);
        }
        L_local = local_40;
      }
    }
    else {
      L_local = (lua_State *)(L->top + idx);
    }
  }
  else {
    L_local = (lua_State *)(pCVar1->func + idx);
    if ((lua_State *)L->top <= L_local) {
      L_local = (lua_State *)&luaO_nilobject_;
    }
  }
  return (TValue *)L_local;
}

Assistant:

static TValue *index2addr (lua_State *L, int idx) {
  CallInfo *ci = L->ci;
  if (idx > 0) {
    TValue *o = ci->func + idx;
    api_check(L, idx <= ci->top - (ci->func + 1), "unacceptable index");
    if (o >= L->top) return NONVALIDVALUE;
    else return o;
  }
  else if (!ispseudo(idx)) {  /* negative index */
    api_check(L, idx != 0 && -idx <= L->top - (ci->func + 1), "invalid index");
    return L->top + idx;
  }
  else if (idx == LUA_REGISTRYINDEX)
    return &G(L)->l_registry;
  else {  /* upvalues */
    idx = LUA_REGISTRYINDEX - idx;
    api_check(L, idx <= MAXUPVAL + 1, "upvalue index too large");
    if (ttislcf(ci->func))  /* light C function? */
      return NONVALIDVALUE;  /* it has no upvalues */
    else {
      CClosure *func = clCvalue(ci->func);
      return (idx <= func->nupvalues) ? &func->upvalue[idx-1] : NONVALIDVALUE;
    }
  }
}